

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::jacobiSVD<double>
               (Matrix33<double> *A,Matrix33<double> *U,Vec3<double> *S,Matrix33<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined8 uVar5;
  int i;
  uint uVar6;
  bool bVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double __tmp;
  double dVar15;
  double dVar16;
  double r;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  dVar26 = A->x[0][0];
  dVar17 = A->x[0][1];
  dVar18 = A->x[0][2];
  dVar15 = A->x[1][0];
  dVar27 = A->x[1][1];
  dVar21 = A->x[1][2];
  dVar16 = A->x[2][0];
  dVar20 = A->x[2][1];
  dVar24 = A->x[2][2];
  U->x[0][0] = 1.0;
  U->x[0][1] = 0.0;
  U->x[0][2] = 0.0;
  uVar6 = 0;
  U->x[1][0] = 0.0;
  U->x[1][1] = 1.0;
  U->x[1][2] = 0.0;
  U->x[2][0] = 0.0;
  U->x[2][1] = 0.0;
  U->x[2][2] = 1.0;
  V->x[0][0] = 1.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 1.0;
  V->x[1][2] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[2][2] = 1.0;
  dVar28 = ABS(dVar17);
  if (dVar28 <= 0.0) {
    dVar28 = 0.0;
  }
  dVar13 = ABS(dVar18);
  if (ABS(dVar18) <= dVar28) {
    dVar13 = dVar28;
  }
  dVar28 = ABS(dVar15);
  if (ABS(dVar15) <= dVar13) {
    dVar28 = dVar13;
  }
  dVar13 = ABS(dVar21);
  if (ABS(dVar21) <= dVar28) {
    dVar13 = dVar28;
  }
  dVar28 = ABS(dVar16);
  if (ABS(dVar16) <= dVar13) {
    dVar28 = dVar13;
  }
  dVar13 = ABS(dVar20);
  if (ABS(dVar20) <= dVar28) {
    dVar13 = dVar28;
  }
  dVar13 = dVar13 * tol;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    do {
      if (ABS(dVar17 - dVar15) <= ABS(dVar27 + dVar26) * tol) {
        dVar19 = dVar27 - dVar26;
        dVar28 = dVar15 + dVar17;
        dVar29 = 0.0;
        dVar25 = 1.0;
        if (ABS(dVar19) * tol < ABS(dVar28)) goto LAB_00104407;
        bVar12 = false;
      }
      else {
        dVar25 = (dVar27 + dVar26) / (dVar17 - dVar15);
        dVar28 = 1.0 / SQRT(dVar25 * dVar25 + 1.0);
        dVar29 = (double)((ulong)-dVar28 & -(ulong)(dVar25 < 0.0) |
                         ~-(ulong)(dVar25 < 0.0) & (ulong)dVar28);
        dVar25 = dVar25 * dVar29;
        dVar19 = (dVar15 + dVar17) * dVar29 + (dVar27 - dVar26) * dVar25;
        dVar28 = dVar25 * dVar17 - dVar29 * dVar27;
        dVar28 = dVar28 + dVar28;
        dVar23 = 1.0;
        dVar14 = 0.0;
        if (ABS(dVar19) * tol < ABS(dVar28)) {
LAB_00104407:
          dVar19 = dVar19 / dVar28;
          dVar28 = 1.0 / (SQRT(dVar19 * dVar19 + 1.0) + ABS(dVar19));
          dVar14 = (double)((ulong)-dVar28 & -(ulong)(dVar19 < 0.0) |
                           ~-(ulong)(dVar19 < 0.0) & (ulong)dVar28);
          dVar23 = 1.0 / SQRT(dVar14 * dVar14 + 1.0);
          dVar14 = dVar14 * dVar23;
        }
        dVar28 = dVar14 * dVar25 + dVar29 * dVar23;
        dVar29 = dVar25 * dVar23 + dVar29 * -dVar14;
        dVar19 = dVar20 * -dVar14;
        dVar25 = dVar21 * -dVar28;
        lVar8 = 0;
        do {
          dVar22 = *(double *)((long)U->x[0] + lVar8);
          dVar2 = *(double *)((long)U->x[0] + lVar8 + 8);
          dVar4 = dVar22 * dVar28 + dVar2 * dVar29;
          auVar3._8_4_ = SUB84(dVar4,0);
          auVar3._0_8_ = dVar22 * dVar29 + -dVar2 * dVar28;
          auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
          *(undefined1 (*) [16])((long)U->x[0] + lVar8) = auVar3;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x48);
        dVar22 = dVar26 * dVar14;
        lVar8 = 0;
        do {
          dVar2 = *(double *)((long)V->x[0] + lVar8);
          dVar4 = *(double *)((long)V->x[0] + lVar8 + 8);
          pdVar9 = (double *)((long)V->x[0] + lVar8);
          *pdVar9 = dVar2 * dVar23 + -dVar4 * dVar14;
          pdVar9[1] = dVar2 * dVar14 + dVar4 * dVar23;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x48);
        dVar26 = dVar29 * (dVar26 * dVar23 + -dVar17 * dVar14) +
                 -dVar28 * (dVar15 * dVar23 + -dVar27 * dVar14);
        dVar27 = dVar28 * (dVar22 + dVar17 * dVar23) + dVar29 * (dVar15 * dVar14 + dVar27 * dVar23);
        dVar20 = dVar20 * dVar23 + dVar14 * dVar16;
        dVar21 = dVar21 * dVar29 + dVar28 * dVar18;
        bVar12 = true;
        dVar16 = dVar23 * dVar16 + dVar19;
        dVar18 = dVar29 * dVar18 + dVar25;
      }
      if (ABS(dVar18 - dVar16) <= ABS(dVar24 + dVar26) * tol) {
        dVar15 = dVar24 - dVar26;
        dVar17 = dVar16 + dVar18;
        dVar28 = 0.0;
        dVar19 = 1.0;
        if (ABS(dVar15) * tol < ABS(dVar17)) goto LAB_00104733;
        bVar7 = false;
        dVar17 = 0.0;
        dVar15 = 0.0;
      }
      else {
        dVar19 = (dVar24 + dVar26) / (dVar18 - dVar16);
        dVar17 = 1.0 / SQRT(dVar19 * dVar19 + 1.0);
        dVar28 = (double)((ulong)-dVar17 & -(ulong)(dVar19 < 0.0) |
                         ~-(ulong)(dVar19 < 0.0) & (ulong)dVar17);
        dVar19 = dVar19 * dVar28;
        dVar15 = (dVar16 + dVar18) * dVar28 + (dVar24 - dVar26) * dVar19;
        dVar17 = dVar19 * dVar18 - dVar28 * dVar24;
        dVar17 = dVar17 + dVar17;
        if (ABS(dVar17) <= ABS(dVar15) * tol) {
          dVar29 = 0.0;
          dVar25 = 1.0;
        }
        else {
LAB_00104733:
          dVar15 = dVar15 / dVar17;
          dVar17 = 1.0 / (SQRT(dVar15 * dVar15 + 1.0) + ABS(dVar15));
          dVar29 = (double)((ulong)-dVar17 & -(ulong)(dVar15 < 0.0) |
                           ~-(ulong)(dVar15 < 0.0) & (ulong)dVar17);
          dVar25 = 1.0 / SQRT(dVar29 * dVar29 + 1.0);
          dVar29 = dVar29 * dVar25;
        }
        dVar23 = dVar29 * dVar19 + dVar28 * dVar25;
        dVar14 = -dVar24;
        dVar28 = dVar25 * dVar19 + -dVar29 * dVar28;
        lVar8 = 0x10;
        do {
          dVar17 = *(double *)((long)(U->x + -1) + 8 + lVar8);
          dVar15 = *(double *)((long)U->x[0] + lVar8);
          *(double *)((long)(U->x + -1) + 8 + lVar8) = dVar28 * dVar17 - dVar23 * dVar15;
          *(double *)((long)U->x[0] + lVar8) = dVar17 * dVar23 + dVar15 * dVar28;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x58);
        dVar17 = dVar28 * 0.0 + -dVar23 * dVar20;
        dVar15 = dVar25 * 0.0 + -dVar29 * dVar21;
        lVar8 = 0x10;
        do {
          dVar19 = *(double *)((long)(V->x + -1) + 8 + lVar8);
          dVar22 = *(double *)((long)V->x[0] + lVar8);
          *(double *)((long)(V->x + -1) + 8 + lVar8) = dVar25 * dVar19 - dVar29 * dVar22;
          *(double *)((long)V->x[0] + lVar8) = dVar19 * dVar29 + dVar22 * dVar25;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x58);
        dVar24 = dVar23 * (dVar26 * dVar29 + dVar18 * dVar25) +
                 dVar28 * (dVar16 * dVar29 + dVar24 * dVar25);
        dVar26 = dVar28 * (dVar26 * dVar25 + -dVar18 * dVar29) +
                 -dVar23 * (dVar16 * dVar25 + dVar14 * dVar29);
        dVar20 = dVar20 * dVar28 + dVar23 * 0.0;
        dVar21 = dVar21 * dVar25 + dVar29 * 0.0;
        bVar7 = true;
      }
      if (ABS(dVar21 - dVar20) <= ABS(dVar27 + dVar24) * tol) {
        dVar16 = dVar24 - dVar27;
        dVar18 = dVar20 + dVar21;
        dVar28 = 0.0;
        dVar19 = 1.0;
        if (ABS(dVar16) * tol < ABS(dVar18)) goto LAB_00104a9d;
        dVar18 = 0.0;
        dVar16 = 0.0;
        if (!bVar12 && !bVar7) break;
      }
      else {
        dVar19 = (dVar27 + dVar24) / (dVar21 - dVar20);
        dVar18 = 1.0 / SQRT(dVar19 * dVar19 + 1.0);
        dVar28 = (double)((ulong)-dVar18 & -(ulong)(dVar19 < 0.0) |
                         ~-(ulong)(dVar19 < 0.0) & (ulong)dVar18);
        dVar19 = dVar19 * dVar28;
        dVar16 = (dVar20 + dVar21) * dVar28 + (dVar24 - dVar27) * dVar19;
        dVar18 = dVar19 * dVar21 - dVar28 * dVar24;
        dVar18 = dVar18 + dVar18;
        dVar29 = 1.0;
        dVar25 = 0.0;
        if (ABS(dVar16) * tol < ABS(dVar18)) {
LAB_00104a9d:
          dVar16 = dVar16 / dVar18;
          dVar18 = 1.0 / (SQRT(dVar16 * dVar16 + 1.0) + ABS(dVar16));
          dVar25 = (double)((ulong)-dVar18 & -(ulong)(dVar16 < 0.0) |
                           ~-(ulong)(dVar16 < 0.0) & (ulong)dVar18);
          dVar29 = 1.0 / SQRT(dVar25 * dVar25 + 1.0);
          dVar25 = dVar25 * dVar29;
        }
        dVar14 = dVar19 * dVar29 + -dVar25 * dVar28;
        dVar28 = dVar19 * dVar25 + dVar29 * dVar28;
        lVar8 = 0;
        do {
          dVar18 = *(double *)((long)U->x[0] + lVar8 + 8);
          dVar16 = *(double *)((long)U->x[0] + lVar8 + 0x10);
          pdVar9 = (double *)((long)U->x[0] + lVar8 + 8);
          *pdVar9 = dVar18 * dVar14 + dVar28 * -dVar16;
          pdVar9[1] = dVar18 * dVar28 + dVar14 * dVar16;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x48);
        dVar18 = dVar27 * dVar25;
        lVar8 = 0;
        do {
          dVar16 = *(double *)((long)V->x[0] + lVar8 + 8);
          dVar19 = *(double *)((long)V->x[0] + lVar8 + 0x10);
          pdVar9 = (double *)((long)V->x[0] + lVar8 + 8);
          *pdVar9 = dVar16 * dVar29 + -dVar19 * dVar25;
          pdVar9[1] = dVar16 * dVar25 + dVar19 * dVar29;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x48);
        dVar27 = dVar14 * (dVar27 * dVar29 + -dVar21 * dVar25) +
                 -dVar28 * (dVar20 * dVar29 + -dVar24 * dVar25);
        dVar24 = dVar28 * (dVar18 + dVar21 * dVar29) + dVar14 * (dVar20 * dVar25 + dVar24 * dVar29);
        dVar18 = dVar25 * dVar17 + dVar29 * 0.0;
        dVar16 = dVar28 * dVar15 + dVar14 * 0.0;
        dVar17 = dVar29 * dVar17 + dVar25 * -0.0;
        dVar15 = dVar14 * dVar15 + dVar28 * -0.0;
      }
      dVar21 = ABS(dVar17);
      if (dVar21 <= 0.0) {
        dVar21 = 0.0;
      }
      dVar20 = ABS(dVar18);
      if (ABS(dVar18) <= dVar21) {
        dVar20 = dVar21;
      }
      dVar21 = ABS(dVar15);
      if (ABS(dVar15) <= dVar20) {
        dVar21 = dVar20;
      }
      dVar20 = ABS(dVar16);
      if (ABS(dVar16) <= dVar21) {
        dVar20 = dVar21;
      }
      if (dVar20 <= dVar13) break;
      dVar20 = 0.0;
      dVar21 = 0.0;
      bVar12 = uVar6 < 0x13;
      uVar6 = uVar6 + 1;
    } while (bVar12);
  }
  S->x = dVar26;
  S->y = dVar27;
  S->z = dVar24;
  lVar8 = 0;
  pdVar9 = (double *)U;
  do {
    if ((&S->x)[lVar8] < 0.0) {
      (&S->x)[lVar8] = -(&S->x)[lVar8];
      lVar10 = 0;
      do {
        *(ulong *)((long)pdVar9 + lVar10) = *(ulong *)((long)pdVar9 + lVar10) ^ 0x8000000000000000;
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x48);
    }
    lVar8 = lVar8 + 1;
    pdVar9 = pdVar9 + 1;
  } while (lVar8 != 3);
  lVar8 = 2;
  bVar12 = true;
  do {
    bVar7 = bVar12;
    lVar10 = 0;
    pdVar9 = (double *)V;
    pdVar11 = (double *)U;
    do {
      dVar26 = (&S->x)[lVar10];
      lVar1 = lVar10 + 1;
      if (dVar26 < (&S->y)[lVar10]) {
        (&S->x)[lVar10] = (&S->y)[lVar10];
        (&S->y)[lVar10] = dVar26;
        lVar10 = 0;
        do {
          uVar5 = *(undefined8 *)((long)pdVar11 + lVar10);
          *(undefined8 *)((long)pdVar11 + lVar10) = ((undefined8 *)((long)pdVar11 + lVar10))[1];
          ((undefined8 *)((long)pdVar11 + lVar10))[1] = uVar5;
          lVar10 = lVar10 + 0x18;
        } while (lVar10 != 0x48);
        lVar10 = 0;
        do {
          uVar5 = *(undefined8 *)((long)pdVar9 + lVar10);
          *(undefined8 *)((long)pdVar9 + lVar10) = ((undefined8 *)((long)pdVar9 + lVar10))[1];
          ((undefined8 *)((long)pdVar9 + lVar10))[1] = uVar5;
          lVar10 = lVar10 + 0x18;
        } while (lVar10 != 0x48);
      }
      pdVar11 = pdVar11 + 1;
      pdVar9 = pdVar9 + 1;
      lVar10 = lVar1;
    } while (lVar1 != lVar8);
    lVar8 = lVar8 + -1;
    bVar12 = false;
  } while (bVar7);
  if (forcePositiveDeterminant) {
    dVar26 = U->x[1][0];
    dVar17 = U->x[1][1];
    dVar18 = U->x[2][2];
    dVar15 = U->x[1][2];
    dVar27 = U->x[2][1];
    dVar21 = U->x[2][0];
    if ((dVar26 * dVar27 - dVar21 * dVar17) * U->x[0][2] +
        (dVar17 * dVar18 - dVar27 * dVar15) * U->x[0][0] +
        (dVar15 * dVar21 - dVar18 * dVar26) * U->x[0][1] < 0.0) {
      lVar8 = 0x10;
      do {
        *(ulong *)((long)U->x[0] + lVar8) = *(ulong *)((long)U->x[0] + lVar8) ^ 0x8000000000000000;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x58);
      S->z = -S->z;
    }
    dVar26 = V->x[1][0];
    dVar17 = V->x[1][1];
    dVar18 = V->x[2][2];
    dVar15 = V->x[1][2];
    dVar27 = V->x[2][1];
    dVar21 = V->x[2][0];
    if ((dVar26 * dVar27 - dVar21 * dVar17) * V->x[0][2] +
        (dVar17 * dVar18 - dVar27 * dVar15) * V->x[0][0] +
        (dVar15 * dVar21 - dVar18 * dVar26) * V->x[0][1] < 0.0) {
      lVar8 = 0x10;
      do {
        *(ulong *)((long)V->x[0] + lVar8) = *(ulong *)((long)V->x[0] + lVar8) ^ 0x8000000000000000;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x58);
      S->z = -S->z;
    }
  }
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}